

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashtbl.c
# Opt level: O0

void tommy_hashtable_insert
               (tommy_hashtable *hashtable,tommy_hashtable_node *node,void *data,tommy_hash_t hash)

{
  long lVar1;
  long in_FS_OFFSET;
  tommy_count_t pos;
  tommy_hash_t hash_local;
  void *data_local;
  tommy_hashtable_node *node_local;
  tommy_hashtable *hashtable_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  tommy_list_insert_tail(hashtable->bucket + (hash & hashtable->bucket_mask),node,data);
  node->key = hash;
  hashtable->count = hashtable->count + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void tommy_hashtable_insert(tommy_hashtable* hashtable, tommy_hashtable_node* node, void* data, tommy_hash_t hash)
{
	tommy_count_t pos = hash & hashtable->bucket_mask;

	tommy_list_insert_tail(&hashtable->bucket[pos], node, data);

	node->key = hash;

	++hashtable->count;
}